

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_33808::
ARTCorrectnessTest_DuplicateKey_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTCorrectnessTest_DuplicateKey_Test
          (ARTCorrectnessTest_DuplicateKey_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, DuplicateKey) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert(0, unodb::test::test_values[0]);

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({1, 0, 0, 0, 0});

  const auto mem_use_before = verifier.get_db().get_current_memory_use();
#endif  // UNODB_DETAIL_WITH_STATS

  unodb::test::must_not_allocate([&verifier] {
    UNODB_ASSERT_FALSE(verifier.try_insert(0, unodb::test::test_values[3]));
  });

  verifier.check_present_values();

#ifdef UNODB_DETAIL_WITH_STATS
  UNODB_ASSERT_EQ(mem_use_before, verifier.get_db().get_current_memory_use());

  verifier.assert_node_counts({1, 0, 0, 0, 0});
  verifier.assert_growing_inodes({0, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
}